

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

void __thiscall
TPZFNMatrix<100,_std::complex<long_double>_>::TPZFNMatrix
          (TPZFNMatrix<100,_std::complex<long_double>_> *this,int64_t row,int64_t col,
          complex<long_double> *val)

{
  long lVar1;
  
  (this->super_TPZFMatrix<std::complex<long_double>_>).super_TPZMatrix<std::complex<long_double>_>.
  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_0166f3c0;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix
            (&this->super_TPZFMatrix<std::complex<long_double>_>,&PTR_PTR_0166f678,row,col,
             this->fBuf,100);
  (this->super_TPZFMatrix<std::complex<long_double>_>).super_TPZMatrix<std::complex<long_double>_>.
  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_0166f3c0;
  lVar1 = 0xa0;
  do {
    *(longdouble *)
     ((long)(this->super_TPZFMatrix<std::complex<long_double>_>).fPivot.fExtAlloc + lVar1 + -0x68) =
         (longdouble)0;
    *(longdouble *)
     ((long)(&((TPZFMatrix<std::complex<long_double>_> *)
              (&((TPZFMatrix<std::complex<long_double>_> *)
                (&(this->super_TPZFMatrix<std::complex<long_double>_>).fPivot + -1))->fPivot + -1))
              ->fPivot + 0xffffffffffffffff) + lVar1) = (longdouble)0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0xd40);
  TPZFMatrix<std::complex<long_double>_>::operator=
            (&this->super_TPZFMatrix<std::complex<long_double>_>,
             *(complex<long_double> *)val->_M_value);
  return;
}

Assistant:

inline  TPZFNMatrix(int64_t row, int64_t col, const TVar &val) : TPZRegisterClassId(&TPZFNMatrix<N,TVar>::ClassId), 
    TPZFMatrix<TVar>(row,col,fBuf,N) {
        TPZFMatrix<TVar>::operator=(val);
    }